

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_context.c
# Opt level: O1

int SUNContext_Free(SUNContext *sunctx)

{
  SUNContext p_Var1;
  
  if ((sunctx != (SUNContext *)0x0) && (p_Var1 = *sunctx, p_Var1 != (SUNContext)0x0)) {
    if ((p_Var1->logger != (SUNLogger)0x0) && (p_Var1->own_logger != 0)) {
      SUNLogger_Destroy(&p_Var1->logger);
    }
    free(*sunctx);
    *sunctx = (SUNContext)0x0;
  }
  return 0;
}

Assistant:

int SUNContext_Free(SUNContext* sunctx)
{
#if defined(SUNDIALS_BUILD_WITH_PROFILING) && !defined(SUNDIALS_CALIPER_ENABLED)
  FILE* fp;
  char* sunprofiler_print_env;
#endif

  if (!sunctx)
  {
    return (0);
  }
  if (!(*sunctx))
  {
    return (0);
  }

#if defined(SUNDIALS_BUILD_WITH_PROFILING) && !defined(SUNDIALS_CALIPER_ENABLED)
  /* Find out where we are printing to */
  sunprofiler_print_env = getenv("SUNPROFILER_PRINT");
  fp                    = NULL;
  if (sunprofiler_print_env)
  {
    if (!strcmp(sunprofiler_print_env, "0"))
      fp = NULL;
    else if (!strcmp(sunprofiler_print_env, "1") ||
             !strcmp(sunprofiler_print_env, "TRUE") ||
             !strcmp(sunprofiler_print_env, "stdout"))
      fp = stdout;
    else
      fp = fopen(sunprofiler_print_env, "a");
  }

  /* Enforce that the profiler is freed before finalizing,
     if it is not owned by the sunctx. */
  if ((*sunctx)->profiler)
  {
    if (fp) SUNProfiler_Print((*sunctx)->profiler, fp);
    if (fp) fclose(fp);
    if ((*sunctx)->own_profiler) SUNProfiler_Free(&(*sunctx)->profiler);
  }
#endif

  if ((*sunctx)->logger && (*sunctx)->own_logger)
  {
    SUNLogger_Destroy(&(*sunctx)->logger);
  }

  free(*sunctx);
  *sunctx = NULL;

  return (0);
}